

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::read_next
          (basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  parse_state pVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  char_type *pcVar3;
  char_type *pcVar4;
  json_errc __e;
  bool bVar5;
  span<const_char,_18446744073709551615UL> sVar6;
  
  pbVar2 = (this->source_).source_.stream_ptr_;
  if (((&pbVar2->field_0x20)[(long)pbVar2->_vptr_basic_istream[-3]] & 1) == 0) {
    this_00 = &this->parser_;
    basic_json_parser<char,_std::allocator<char>_>::reset(this_00);
    __e = unexpected_eof;
    do {
      if ((this->parser_).more_ != true) {
LAB_00172f2a:
        basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(this_00);
        while( true ) {
          if (((this->source_).source_.buffer_length_ == 0) &&
             (pbVar2 = (this->source_).source_.stream_ptr_,
             ((&pbVar2->field_0x20)[(long)pbVar2->_vptr_basic_istream[-3]] & 2) != 0)) {
            return;
          }
          basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(this_00);
          if ((this->parser_).input_ptr_ != (this->parser_).end_input_) {
            return;
          }
          sVar6 = json_source_adaptor<jsoncons::stream_source<char>_>::read_buffer
                            (&this->source_,ec);
          pcVar4 = sVar6.data_;
          if (ec->_M_value != 0) break;
          if (sVar6.size_ != 0) {
            (this->parser_).begin_input_ = pcVar4;
            (this->parser_).end_input_ = pcVar4 + sVar6.size_;
            (this->parser_).input_ptr_ = pcVar4;
          }
        }
        return;
      }
      pcVar4 = (this->parser_).end_input_;
      pcVar3 = (this->parser_).input_ptr_;
      if (pcVar3 == pcVar4) {
        sVar6 = json_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(&this->source_,ec);
        pcVar3 = sVar6.data_;
        if (ec->_M_value != 0) {
          return;
        }
        if (sVar6.size_ == 0) {
          pcVar4 = (this->parser_).end_input_;
          pcVar3 = (this->parser_).input_ptr_;
        }
        else {
          (this->parser_).begin_input_ = pcVar3;
          pcVar4 = pcVar3 + sVar6.size_;
          (this->parser_).end_input_ = pcVar4;
          (this->parser_).input_ptr_ = pcVar3;
        }
      }
      basic_json_parser<char,_std::allocator<char>_>::parse_some_(this_00,this->visitor_,ec);
      bVar5 = ec->_M_value != 0;
      if (pcVar3 == pcVar4 && !bVar5) {
        pVar1 = (this->parser_).state_;
        if (pVar1 == start) goto LAB_00172f2a;
        bVar5 = false;
        if ((pVar1 != accept) && (((this->parser_).done_ & 1U) == 0)) goto LAB_00172f18;
      }
      if (bVar5) {
        return;
      }
    } while( true );
  }
  __e = source_error;
LAB_00172f18:
  std::error_code::operator=(ec,__e);
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }        
            parser_.reset();
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                bool eof = parser_.source_exhausted();
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                if (eof)
                {
                    if (parser_.enter())
                    {
                        break;
                    }
                    else if (!parser_.accept())
                    {
                        ec = json_errc::unexpected_eof;
                        return;
                    }
                }
            }
            
            parser_.skip_whitespace();
            while (!source_.eof())
            {
                parser_.skip_whitespace();
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                else
                {
                    break;
                }
            }
        }